

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
DiceRoller::roll(vector<int,_std::allocator<int>_> *__return_storage_ptr__,DiceRoller *this,
                int numDice)

{
  int iVar1;
  undefined8 in_RAX;
  vector<int,_std::allocator<int>_> *__x;
  int iVar2;
  bool bVar3;
  undefined4 uStack_38;
  int result;
  
  _uStack_38 = in_RAX;
  __x = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  iVar2 = 0;
  if (0 < numDice) {
    iVar2 = numDice;
  }
  (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    iVar1 = Dice::roll();
    _uStack_38 = CONCAT44(iVar1,uStack_38);
    std::vector<int,_std::allocator<int>_>::push_back(__x,&result);
    saveRoll(this,result);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__x);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> DiceRoller::roll(int numDice) {
    auto* results = new std::vector<int>();
    for (int i = 0; i < numDice; i++) {
        int result = Dice::roll();
        results->push_back(result);
        saveRoll(result);
    }

    std::sort(results->begin(), results->end());
    return *results;
}